

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O1

bool __thiscall
google::protobuf::SimpleDescriptorDatabase::
DescriptorIndex<const_google::protobuf::FileDescriptorProto_*>::AddFile
          (DescriptorIndex<const_google::protobuf::FileDescriptorProto_*> *this,
          FileDescriptorProto *file,FileDescriptorProto *value)

{
  int iVar1;
  pointer pcVar2;
  bool bVar3;
  bool bVar4;
  LogMessage *pLVar5;
  long lVar6;
  long lVar7;
  string path;
  FileDescriptorProto *local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  undefined1 local_a0 [56];
  LogMessage local_68;
  
  local_e8 = value;
  bVar3 = InsertIfNotPresent<std::map<std::__cxx11::string,google::protobuf::FileDescriptorProto_const*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::FileDescriptorProto_const*>>>,std::__cxx11::string,google::protobuf::FileDescriptorProto_const*>
                    (&this->by_name_,file->name_,&local_e8);
  if (!bVar3) {
    internal::LogMessage::LogMessage
              ((LogMessage *)local_a0,LOGLEVEL_ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/descriptor_database.cc"
               ,0x39);
    pLVar5 = internal::LogMessage::operator<<
                       ((LogMessage *)local_a0,"File already exists in database: ");
    pLVar5 = internal::LogMessage::operator<<(pLVar5,file->name_);
    internal::LogFinisher::operator=((LogFinisher *)&local_68,pLVar5);
    internal::LogMessage::~LogMessage((LogMessage *)local_a0);
    return false;
  }
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  if ((file->_has_bits_[0] & 2) == 0) {
    local_e0._M_string_length = 0;
    local_e0.field_2._M_local_buf[0] = '\0';
  }
  else {
    pcVar2 = (file->package_->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_e0,pcVar2,pcVar2 + file->package_->_M_string_length);
  }
  if (local_e0._M_string_length != 0) {
    std::__cxx11::string::push_back((char)&local_e0);
  }
  if (0 < (file->message_type_).super_RepeatedPtrFieldBase.current_size_) {
    lVar7 = 0;
    do {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                     &local_e0,
                     *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                      ((long)(file->message_type_).super_RepeatedPtrFieldBase.elements_[lVar7] +
                      0x10));
      bVar3 = AddSymbol(this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_a0,local_e8);
      if ((undefined1 *)local_a0._0_8_ != local_a0 + 0x10) {
        operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
      }
      if (!bVar3) goto LAB_001f8289;
      if ((file->message_type_).super_RepeatedPtrFieldBase.current_size_ <= lVar7) {
        internal::LogMessage::LogMessage
                  (&local_68,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/repeated_field.h"
                   ,0x338);
        pLVar5 = internal::LogMessage::operator<<(&local_68,"CHECK failed: (index) < (size()): ");
        internal::LogFinisher::operator=((LogFinisher *)local_a0,pLVar5);
        internal::LogMessage::~LogMessage(&local_68);
      }
      bVar3 = AddNestedExtensions(this,(DescriptorProto *)
                                       (file->message_type_).super_RepeatedPtrFieldBase.elements_
                                       [lVar7],local_e8);
      if (!bVar3) goto LAB_001f8289;
      lVar7 = lVar7 + 1;
    } while (lVar7 < (file->message_type_).super_RepeatedPtrFieldBase.current_size_);
  }
  if (0 < (file->enum_type_).super_RepeatedPtrFieldBase.current_size_) {
    lVar7 = 0;
    do {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                     &local_e0,
                     *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                      ((long)(file->enum_type_).super_RepeatedPtrFieldBase.elements_[lVar7] + 0x10))
      ;
      bVar3 = AddSymbol(this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_a0,local_e8);
      if ((undefined1 *)local_a0._0_8_ != local_a0 + 0x10) {
        operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
      }
      if (!bVar3) goto LAB_001f8289;
      lVar7 = lVar7 + 1;
    } while (lVar7 < (file->enum_type_).super_RepeatedPtrFieldBase.current_size_);
  }
  if (0 < (file->extension_).super_RepeatedPtrFieldBase.current_size_) {
    lVar7 = 0;
    do {
      std::operator+(&local_c0,&local_e0,
                     *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                      ((long)(file->extension_).super_RepeatedPtrFieldBase.elements_[lVar7] + 0x10))
      ;
      bVar3 = AddSymbol(this,&local_c0,local_e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      if (!bVar3) goto LAB_001f8289;
      if ((file->extension_).super_RepeatedPtrFieldBase.current_size_ <= lVar7) {
        internal::LogMessage::LogMessage
                  ((LogMessage *)local_a0,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/repeated_field.h"
                   ,0x338);
        pLVar5 = internal::LogMessage::operator<<
                           ((LogMessage *)local_a0,"CHECK failed: (index) < (size()): ");
        internal::LogFinisher::operator=((LogFinisher *)&local_c0,pLVar5);
        internal::LogMessage::~LogMessage((LogMessage *)local_a0);
      }
      bVar3 = AddExtension(this,(FieldDescriptorProto *)
                                (file->extension_).super_RepeatedPtrFieldBase.elements_[lVar7],
                           local_e8);
      if (!bVar3) goto LAB_001f8289;
      lVar7 = lVar7 + 1;
    } while (lVar7 < (file->extension_).super_RepeatedPtrFieldBase.current_size_);
  }
  iVar1 = (file->service_).super_RepeatedPtrFieldBase.current_size_;
  bVar3 = iVar1 < 1;
  if (0 < iVar1) {
    lVar7 = 0;
    do {
      std::operator+(&local_c0,&local_e0,
                     *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                      ((long)(file->service_).super_RepeatedPtrFieldBase.elements_[lVar7] + 0x10));
      bVar4 = AddSymbol(this,&local_c0,local_e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      if (!bVar4) break;
      lVar7 = lVar7 + 1;
      lVar6 = (long)(file->service_).super_RepeatedPtrFieldBase.current_size_;
      bVar3 = lVar6 <= lVar7;
    } while (lVar7 < lVar6);
  }
LAB_001f828b:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,
                    CONCAT71(local_e0.field_2._M_allocated_capacity._1_7_,
                             local_e0.field_2._M_local_buf[0]) + 1);
  }
  return bVar3;
LAB_001f8289:
  bVar3 = false;
  goto LAB_001f828b;
}

Assistant:

bool SimpleDescriptorDatabase::DescriptorIndex<Value>::AddFile(
    const FileDescriptorProto& file,
    Value value) {
  if (!InsertIfNotPresent(&by_name_, file.name(), value)) {
    GOOGLE_LOG(ERROR) << "File already exists in database: " << file.name();
    return false;
  }

  // We must be careful here -- calling file.package() if file.has_package() is
  // false could access an uninitialized static-storage variable if we are being
  // run at startup time.
  string path = file.has_package() ? file.package() : string();
  if (!path.empty()) path += '.';

  for (int i = 0; i < file.message_type_size(); i++) {
    if (!AddSymbol(path + file.message_type(i).name(), value)) return false;
    if (!AddNestedExtensions(file.message_type(i), value)) return false;
  }
  for (int i = 0; i < file.enum_type_size(); i++) {
    if (!AddSymbol(path + file.enum_type(i).name(), value)) return false;
  }
  for (int i = 0; i < file.extension_size(); i++) {
    if (!AddSymbol(path + file.extension(i).name(), value)) return false;
    if (!AddExtension(file.extension(i), value)) return false;
  }
  for (int i = 0; i < file.service_size(); i++) {
    if (!AddSymbol(path + file.service(i).name(), value)) return false;
  }

  return true;
}